

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O3

void __thiscall
gimage::HighDynamicRangeFusion<float>::mulSaturationWeight
          (HighDynamicRangeFusion<float> *this,ImageFloat *wp,
          Image<float,_gimage::PixelTraits<float>_> *image,float max_value)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  lVar2 = image->height;
  if (0 < lVar2) {
    uVar1 = image->depth;
    fVar10 = (float)(int)uVar1;
    pfVar6 = **wp->img;
    lVar3 = image->width;
    lVar5 = 0;
    do {
      if (0 < lVar3) {
        pppfVar4 = image->img;
        lVar8 = 0;
        pfVar7 = pfVar6;
        do {
          if ((int)uVar1 < 1) {
            fVar11 = 0.0;
            fVar12 = 0.0;
          }
          else {
            fVar12 = 0.0;
            uVar9 = 0;
            fVar11 = 0.0;
            do {
              fVar13 = pppfVar4[uVar9][lVar5][lVar8] * (1.0 / max_value);
              fVar12 = fVar12 + fVar13;
              fVar11 = fVar11 + fVar13 * fVar13;
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
          fVar11 = (fVar11 - fVar10 * (fVar12 / fVar10) * (fVar12 / fVar10)) / fVar10;
          if (fVar11 <= 0.0) {
            fVar11 = 0.0;
          }
          pfVar6 = pfVar7 + 1;
          *pfVar7 = SQRT(fVar11) * *pfVar7;
          lVar8 = lVar8 + 1;
          pfVar7 = pfVar6;
        } while (lVar8 != lVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar2);
  }
  return;
}

Assistant:

void mulSaturationWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float scale=1.0f/max_value;
      int n=image.getDepth();

      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float ssum=0;
          float mean=0;

          for (int d=0; d<n; d++)
          {
            float v=scale*image.get(i, k, d);
            ssum+=v*v;
            mean+=v;
          }

          mean/=n;

          // multiply standard deviation of color values

          *p++ *= static_cast<float>(std::sqrt(std::max(0.0f, (ssum-n*mean*mean)/n)));
        }
      }
    }